

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O1

int32_t DotProductWithScale(int16_t *vector1,int16_t *vector2,size_t length,int scaling)

{
  ulong uVar1;
  int iVar2;
  byte bVar3;
  ulong uVar4;
  size_t sVar5;
  
  bVar3 = (byte)scaling;
  if (length < 4) {
    iVar2 = 0;
    sVar5 = 0;
  }
  else {
    iVar2 = 0;
    uVar1 = 3;
    do {
      uVar4 = uVar1;
      iVar2 = ((int)vector2[uVar4] * (int)vector1[uVar4] >> (bVar3 & 0x1f)) +
              ((int)vector2[uVar4 - 1] * (int)vector1[uVar4 - 1] >> (bVar3 & 0x1f)) +
              ((int)vector2[uVar4 - 2] * (int)vector1[uVar4 - 2] >> (bVar3 & 0x1f)) +
              ((int)vector2[uVar4 - 3] * (int)vector1[uVar4 - 3] >> (bVar3 & 0x1f)) + iVar2;
      uVar1 = uVar4 + 4;
    } while (uVar4 + 4 < length);
    sVar5 = uVar4 + 1;
  }
  if (sVar5 < length) {
    do {
      iVar2 = iVar2 + ((int)vector2[sVar5] * (int)vector1[sVar5] >> (bVar3 & 0x1f));
      sVar5 = sVar5 + 1;
    } while (length != sVar5);
  }
  return iVar2;
}

Assistant:

int32_t DotProductWithScale(const int16_t *vector1, const int16_t *vector2, size_t length, int scaling) {
    int64_t sum = 0;
    size_t i = 0;

    /* Unroll the loop to improve performance. */
    for (i = 0; i + 3 < length; i += 4) {
        sum += (vector1[i + 0] * vector2[i + 0]) >> scaling;
        sum += (vector1[i + 1] * vector2[i + 1]) >> scaling;
        sum += (vector1[i + 2] * vector2[i + 2]) >> scaling;
        sum += (vector1[i + 3] * vector2[i + 3]) >> scaling;
    }
    for (; i < length; i++) {
        sum += (vector1[i] * vector2[i]) >> scaling;
    }

    return (int32_t) (sum);
}